

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcModule.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  MCRegisterInfo *mri;
  cs_struct *ud_local;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  SystemZ_init(MRI);
  *(code **)(ctx + 8) = SystemZ_printInst;
  *(MCRegisterInfo **)(ctx + 0x10) = MRI;
  *(MCRegisterInfo **)(ctx + 0x20) = MRI;
  *(code **)(ctx + 0x18) = SystemZ_getInstruction;
  *(code **)(ctx + 0x50) = SystemZ_post_printer;
  *(code **)(ctx + 0x30) = SystemZ_reg_name;
  *(code **)(ctx + 0x48) = SystemZ_get_insn_id;
  *(code **)(ctx + 0x38) = SystemZ_insn_name;
  *(code **)(ctx + 0x40) = SystemZ_group_name;
  return 0;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_BIG_ENDIAN | CS_MODE_V9))
		return CS_ERR_MODE;

	mri = cs_mem_malloc(sizeof(*mri));

	Sparc_init(mri);
	ud->printer = Sparc_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = Sparc_getInstruction;
	ud->post_printer = Sparc_post_printer;

	ud->reg_name = Sparc_reg_name;
	ud->insn_id = Sparc_get_insn_id;
	ud->insn_name = Sparc_insn_name;
	ud->group_name = Sparc_group_name;

	return CS_ERR_OK;
}